

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

int insertNewKeyValue(MAP_HANDLE_DATA *handleData,char *key,char *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  char *value_local;
  char *key_local;
  MAP_HANDLE_DATA *handleData_local;
  
  iVar1 = Map_IncreaseStorageKeysValues(handleData);
  if (iVar1 == 0) {
    iVar1 = mallocAndStrcpy_s(handleData->keys + (handleData->count - 1),key);
    if (iVar1 == 0) {
      iVar1 = mallocAndStrcpy_s(handleData->values + (handleData->count - 1),value);
      if (iVar1 == 0) {
        l._4_4_ = 0;
      }
      else {
        free(handleData->keys[handleData->count - 1]);
        Map_DecreaseStorageKeysValues(handleData);
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/map.c"
                    ,"insertNewKeyValue",0x148,1,"unable to mallocAndStrcpy_s");
        }
        l._4_4_ = 0x149;
      }
    }
    else {
      Map_DecreaseStorageKeysValues(handleData);
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/map.c"
                  ,"insertNewKeyValue",0x13f,1,"unable to mallocAndStrcpy_s");
      }
      l._4_4_ = 0x140;
    }
  }
  else {
    l._4_4_ = 0x138;
  }
  return l._4_4_;
}

Assistant:

static int insertNewKeyValue(MAP_HANDLE_DATA* handleData, const char* key, const char* value)
{
    int result;
    if (Map_IncreaseStorageKeysValues(handleData) != 0) /*this increases handleData->count*/
    {
        result = MU_FAILURE;
    }
    else
    {
        if (mallocAndStrcpy_s(&(handleData->keys[handleData->count - 1]), key) != 0)
        {
            Map_DecreaseStorageKeysValues(handleData);
            LogError("unable to mallocAndStrcpy_s");
            result = MU_FAILURE;
        }
        else
        {
            if (mallocAndStrcpy_s(&(handleData->values[handleData->count - 1]), value) != 0)
            {
                free(handleData->keys[handleData->count - 1]);
                Map_DecreaseStorageKeysValues(handleData);
                LogError("unable to mallocAndStrcpy_s");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
    }
    return result;
}